

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

int __thiscall CTcCodeStream::has_fixup_at_ofs(CTcCodeStream *this,CTcCodeLabel *lbl,ulong ofs)

{
  CTcLabelFixup *fixup;
  ulong ofs_local;
  CTcCodeLabel *lbl_local;
  CTcCodeStream *this_local;
  
  fixup = lbl->fhead;
  while( true ) {
    if (fixup == (CTcLabelFixup *)0x0) {
      return 0;
    }
    if (fixup->ofs == ofs) break;
    fixup = fixup->nxt;
  }
  return 1;
}

Assistant:

int CTcCodeStream::has_fixup_at_ofs(CTcCodeLabel *lbl, ulong ofs)
{
    CTcLabelFixup *fixup;
    
    /* scan for a match */
    for (fixup = lbl->fhead ; fixup != 0 ; fixup = fixup->nxt)
    {
        /* if this is a match, indicate success */
        if (fixup->ofs == ofs)
            return TRUE;
    }

    /* we didn't find a match */
    return FALSE;
}